

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

void __thiscall
Well<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,Detail::M3<7>,Detail::M1,Detail::M3<12>,Detail::M3<-10>,Detail::M3<-19>,Detail::M2<-11>,Detail::M3<4>,Detail::M3<-10>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,Detail::M3<7>,Detail::M1,Detail::M3<12>,Detail::M3<_10>,Detail::M3<_19>,Detail::M2<_11>,Detail::M3<4>,Detail::M3<_10>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  uint *puVar1;
  invalid_argument *this_00;
  long lVar2;
  
  *(undefined8 *)(this + 0x9c0) = 0;
  puVar1 = *first;
  lVar2 = 0;
  do {
    if (puVar1 == last) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    *(uint *)(this + lVar2 * 4) = *puVar1;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
    *first = puVar1;
  } while (lVar2 != 0x270);
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }